

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O2

PyObject * pybind11::detail::make_new_instance(PyTypeObject *type,bool allocate_value)

{
  pointer pptVar1;
  pointer pptVar2;
  void **ppvVar3;
  instance *this;
  void *valptr;
  undefined7 in_register_00000031;
  iterator __begin3;
  iterator iStack_68;
  values_and_holders local_38;
  
  this = (instance *)(*type->tp_alloc)(type,0);
  instance::allocate_layout(this);
  this->field_0x30 = this->field_0x30 | 1;
  if ((int)CONCAT71(in_register_00000031,allocate_value) != 0) {
    local_38.inst = this;
    local_38.tinfo = all_type_info((this->ob_base).ob_type);
    values_and_holders::begin(&iStack_68,&local_38);
    pptVar1 = ((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pptVar2 = ((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (ppvVar3 = iStack_68.curr.vh, iStack_68.curr.index != (long)pptVar1 - (long)pptVar2 >> 3)
    {
      valptr = (*(iStack_68.curr.type)->operator_new)((iStack_68.curr.type)->type_size);
      *ppvVar3 = valptr;
      register_instance(this,valptr,iStack_68.curr.type);
      values_and_holders::iterator::operator++(&iStack_68);
    }
  }
  return &this->ob_base;
}

Assistant:

inline PyObject *make_new_instance(PyTypeObject *type, bool allocate_value /*= true (in cast.h)*/) {
#if defined(PYPY_VERSION)
    // PyPy gets tp_basicsize wrong (issue 2482) under multiple inheritance when the first inherited
    // object is a a plain Python type (i.e. not derived from an extension type).  Fix it.
    ssize_t instance_size = static_cast<ssize_t>(sizeof(instance));
    if (type->tp_basicsize < instance_size) {
        type->tp_basicsize = instance_size;
    }
#endif
    PyObject *self = type->tp_alloc(type, 0);
    auto inst = reinterpret_cast<instance *>(self);
    // Allocate the value/holder internals:
    inst->allocate_layout();

    inst->owned = true;
    // Allocate (if requested) the value pointers; otherwise leave them as nullptr
    if (allocate_value) {
        for (auto &v_h : values_and_holders(inst)) {
            void *&vptr = v_h.value_ptr();
            vptr = v_h.type->operator_new(v_h.type->type_size);
            register_instance(inst, vptr, v_h.type);
        }
    }

    return self;
}